

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclCon.h
# Opt level: O1

void Scl_ConWrite(Scl_Con_t *p,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  __stream = _stdout;
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"wb");
  }
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  fprintf(__stream,".model %s\n",p->pModelName);
  if (p->pInCellDef != (char *)0x0) {
    fprintf(__stream,".default_%s %s\n","input_cell");
  }
  if (p->tInArrDef != 0) {
    fprintf(__stream,".default_%s %.2f\n",(double)((float)p->tInArrDef / 1000.0),"input_arrival");
  }
  if (p->tInSlewDef != 0) {
    fprintf(__stream,".default_%s %.2f\n",(double)((float)p->tInSlewDef / 1000.0),"input_slew");
  }
  if (p->tInLoadDef != 0) {
    fprintf(__stream,".default_%s %.2f\n",(double)((float)p->tInLoadDef / 1000.0),"input_load");
  }
  if (p->tOutReqDef != 0) {
    fprintf(__stream,".default_%s %.2f\n",(double)((float)p->tOutReqDef / 1000.0),"output_required")
    ;
  }
  if (p->tOutLoadDef != 0) {
    fprintf(__stream,".default_%s %.2f\n",(double)((float)p->tOutLoadDef / 1000.0),"output_load");
  }
  if (0 < (p->vInCells).nSize) {
    lVar4 = 0;
    do {
      pcVar3 = (char *)(p->vInCells).pArray[lVar4];
      if ((pcVar3 != (char *)0x0) &&
         ((p->pInCellDef == (char *)0x0 || (iVar1 = strcmp(pcVar3,p->pInCellDef), iVar1 != 0)))) {
        pcVar2 = Abc_NamStr(p->pNamI,(int)lVar4 + 1);
        fprintf(__stream,".%s %s %s\n","input_cell",pcVar2,pcVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vInCells).nSize);
  }
  if (0 < (p->vInArrs).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vInArrs).pArray[lVar4];
      if (iVar1 != p->tInArrDef) {
        pcVar3 = Abc_NamStr(p->pNamI,(int)lVar4 + 1);
        fprintf(__stream,".%s %s %.2f\n",(double)((float)iVar1 / 1000.0),"input_arrival",pcVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vInArrs).nSize);
  }
  if (0 < (p->vInSlews).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vInSlews).pArray[lVar4];
      if (iVar1 != p->tInSlewDef) {
        pcVar3 = Abc_NamStr(p->pNamI,(int)lVar4 + 1);
        fprintf(__stream,".%s %s %.2f\n",(double)((float)iVar1 / 1000.0),"input_slew",pcVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vInSlews).nSize);
  }
  if (0 < (p->vInLoads).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vInLoads).pArray[lVar4];
      if (iVar1 != p->tInLoadDef) {
        pcVar3 = Abc_NamStr(p->pNamI,(int)lVar4 + 1);
        fprintf(__stream,".%s %s %.2f\n",(double)((float)iVar1 / 1000.0),"input_load",pcVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vInLoads).nSize);
  }
  if (0 < (p->vOutReqs).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vOutReqs).pArray[lVar4];
      if (iVar1 != p->tOutReqDef) {
        pcVar3 = Abc_NamStr(p->pNamO,(int)lVar4 + 1);
        fprintf(__stream,".%s %s %.2f\n",(double)((float)iVar1 / 1000.0),"output_required",pcVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vOutReqs).nSize);
  }
  if (0 < (p->vOutLoads).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vOutLoads).pArray[lVar4];
      if (iVar1 != p->tOutLoadDef) {
        pcVar3 = Abc_NamStr(p->pNamO,(int)lVar4 + 1);
        fprintf(__stream,".%s %s %.2f\n",(double)((float)iVar1 / 1000.0),"output_load",pcVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vOutLoads).nSize);
  }
  if (__stream == _stdout) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

static inline void Scl_ConWrite( Scl_Con_t * p, char * pFileName )
{
    char * pName; int Value; int i;
    FILE * pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, ".model %s\n", p->pModelName );

    if ( p->pInCellDef )        fprintf( pFile, ".default_%s %s\n",   SCL_INPUT_CELL,  p->pInCellDef );
    if ( p->tInArrDef   != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_ARR,   Scl_Int2Flt(p->tInArrDef) );
    if ( p->tInSlewDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_SLEW,  Scl_Int2Flt(p->tInSlewDef) );
    if ( p->tInLoadDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_LOAD,  Scl_Int2Flt(p->tInLoadDef) );
    if ( p->tOutReqDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_OUTPUT_REQ,  Scl_Int2Flt(p->tOutReqDef) );
    if ( p->tOutLoadDef != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_OUTPUT_LOAD, Scl_Int2Flt(p->tOutLoadDef) );

    Vec_PtrForEachEntry(char *, &p->vInCells, pName, i) if ( pName && (!p->pInCellDef || strcmp(pName,p->pInCellDef)) )  fprintf( pFile, ".%s %s %s\n",   SCL_INPUT_CELL,  Abc_NamStr(p->pNamI, i+1), pName );
    Vec_IntForEachEntry( &p->vInArrs, Value, i )        if ( Value != p->tInArrDef )   fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_ARR,   Abc_NamStr(p->pNamI, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vInSlews, Value, i )       if ( Value != p->tInSlewDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_SLEW,  Abc_NamStr(p->pNamI, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vInLoads, Value, i )       if ( Value != p->tInLoadDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_LOAD,  Abc_NamStr(p->pNamI, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vOutReqs, Value, i )       if ( Value != p->tOutReqDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_OUTPUT_REQ,  Abc_NamStr(p->pNamO, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vOutLoads, Value, i )      if ( Value != p->tOutLoadDef ) fprintf( pFile, ".%s %s %.2f\n", SCL_OUTPUT_LOAD, Abc_NamStr(p->pNamO, i+1), Scl_Int2Flt(Value) );

    if ( pFile != stdout )
        fclose ( pFile );
}